

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpringConstraint.cpp
# Opt level: O2

void __thiscall
btGeneric6DofSpringConstraint::btGeneric6DofSpringConstraint
          (btGeneric6DofSpringConstraint *this,btRigidBody *rbA,btRigidBody *rbB,
          btTransform *frameInA,btTransform *frameInB,bool useLinearReferenceFrameA)

{
  btGeneric6DofConstraint::btGeneric6DofConstraint
            (&this->super_btGeneric6DofConstraint,rbA,rbB,frameInA,frameInB,useLinearReferenceFrameA
            );
  (this->super_btGeneric6DofConstraint).super_btTypedConstraint._vptr_btTypedConstraint =
       (_func_int **)&PTR__btTypedConstraint_001f11e8;
  init(this,(EVP_PKEY_CTX *)rbA);
  return;
}

Assistant:

btGeneric6DofSpringConstraint::btGeneric6DofSpringConstraint(btRigidBody& rbA, btRigidBody& rbB, const btTransform& frameInA, const btTransform& frameInB ,bool useLinearReferenceFrameA)
	: btGeneric6DofConstraint(rbA, rbB, frameInA, frameInB, useLinearReferenceFrameA)
{
    init();
}